

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3InsertDocsize(int *pRC,Fts3Table *p,u32 *aSz)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  sqlite3_stmt *pStmt;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  void *zData;
  long lVar7;
  byte *pbVar8;
  ulong uVar9;
  uint uVar10;
  ulong nData;
  long in_FS_OFFSET;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*pRC == 0) {
    iVar1 = p->nColumn;
    iVar5 = sqlite3_initialize();
    iVar6 = 7;
    if (iVar5 == 0) {
      zData = sqlite3Malloc((long)iVar1 * 10);
      if (zData != (void *)0x0) {
        iVar1 = p->nColumn;
        nData = 0;
        if (0 < (long)iVar1) {
          lVar7 = 0;
          do {
            pbVar4 = (byte *)((long)(int)nData + (long)zData);
            uVar9 = (ulong)aSz[lVar7];
            do {
              pbVar8 = pbVar4;
              bVar3 = (byte)uVar9;
              *pbVar8 = bVar3 | 0x80;
              uVar10 = (int)nData + 1;
              nData = (ulong)uVar10;
              bVar2 = 0x7f < uVar9;
              pbVar4 = pbVar8 + 1;
              uVar9 = uVar9 >> 7;
            } while (bVar2);
            *pbVar8 = bVar3;
            lVar7 = lVar7 + 1;
          } while (lVar7 != iVar1);
          nData = (ulong)(int)uVar10;
        }
        local_40 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
        iVar6 = fts3SqlStmt(p,0x14,&local_40,(sqlite3_value **)0x0);
        pStmt = local_40;
        if (iVar6 == 0) {
          sqlite3_bind_int64(local_40,1,p->iPrevDocid);
          bindText(pStmt,2,zData,nData,sqlite3_free,'\0');
          sqlite3_step(pStmt);
          iVar6 = sqlite3_reset(pStmt);
        }
        else {
          sqlite3_free(zData);
        }
      }
    }
    *pRC = iVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3InsertDocsize(
  int *pRC,                       /* Result code */
  Fts3Table *p,                   /* Table into which to insert */
  u32 *aSz                        /* Sizes of each column, in tokens */
){
  char *pBlob;             /* The BLOB encoding of the document size */
  int nBlob;               /* Number of bytes in the BLOB */
  sqlite3_stmt *pStmt;     /* Statement used to insert the encoding */
  int rc;                  /* Result code from subfunctions */

  if( *pRC ) return;
  pBlob = sqlite3_malloc64( 10*(sqlite3_int64)p->nColumn );
  if( pBlob==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  fts3EncodeIntArray(p->nColumn, aSz, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_DOCSIZE, &pStmt, 0);
  if( rc ){
    sqlite3_free(pBlob);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int64(pStmt, 1, p->iPrevDocid);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, sqlite3_free);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
}